

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O2

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueAsKUINT64
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          VariableDatum *this)

{
  pointer O;
  pointer pDVar1;
  double dVar2;
  KBOOL KVar3;
  uint uVar4;
  ulong uVar5;
  NetToDataType<unsigned_long_long> local_30 [8];
  
  KVar3 = UTILS::IsMachineBigEndian();
  O = (this->m_v8DatumValue).
      super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar2 = ceil((double)this->m_ui32DatumLength * 0.125);
  if (O != pDVar1) {
    uVar5 = (ulong)dVar2;
    while (uVar4 = (uint)uVar5, uVar5 = (ulong)(uVar4 - 8), 7 < uVar4) {
      NetToDataType<unsigned_long_long>::NetToDataType(local_30,O->Buffer,!KVar3);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
      emplace_back<unsigned_long_long>(__return_storage_ptr__,(unsigned_long_long *)local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<KUINT64> VariableDatum::GetDatumValueAsKUINT64() const
{
    KBOOL bSwapBytes = !IsMachineBigEndian();

    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    vector<KUINT64> m_Return;

    KUINT32 ui32CurrentPos = 0;
    KUINT32 ui32LengthInOctets = ceil(m_ui32DatumLength / 8.0);

    while( citr != citrEnd )
    {
        if( ( ui32LengthInOctets - ui32CurrentPos ) < 8 )break;

        m_Return.push_back( NetToKUINT64( citr->Buffer, bSwapBytes ).m_Value );

        ui32CurrentPos += 8;
    }

    return m_Return;
}